

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O2

bool __thiscall double_conversion::Bignum::ToHexString(Bignum *this,char *buffer,int buffer_size)

{
  short sVar1;
  int i;
  uint uVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int i_1;
  char *pcVar6;
  long lVar7;
  Chunk CVar8;
  long lVar9;
  
  sVar1 = this->used_bigits_;
  if (sVar1 == 0) {
    if (1 < buffer_size) {
      buffer[0] = '0';
      buffer[1] = '\0';
      return true;
    }
  }
  else {
    iVar3 = ((int)this->exponent_ + (int)sVar1) * 7;
    iVar4 = iVar3 + -8;
    pcVar6 = buffer + (long)iVar3 + -7;
    for (uVar2 = this->bigits_buffer_[(long)(int)sVar1 + -1]; uVar2 != 0; uVar2 = uVar2 >> 4) {
      iVar4 = iVar4 + 1;
      pcVar6 = pcVar6 + 1;
    }
    iVar3 = 0;
    if (iVar4 + 1 < buffer_size) {
      *pcVar6 = '\0';
      for (; iVar3 < this->exponent_; iVar3 = iVar3 + 1) {
        for (lVar7 = 0; (int)lVar7 != -7; lVar7 = lVar7 + -1) {
          buffer[lVar7 + iVar4] = '0';
        }
        iVar4 = iVar4 + -7;
      }
      lVar7 = 0;
      while( true ) {
        if ((long)this->used_bigits_ + -1 <= lVar7) break;
        CVar8 = this->bigits_buffer_[lVar7];
        for (lVar9 = 0; (int)lVar9 != -7; lVar9 = lVar9 + -1) {
          cVar5 = '7';
          if ((CVar8 & 0xf) < 10) {
            cVar5 = '0';
          }
          buffer[lVar9 + iVar4] = cVar5 + (char)(CVar8 & 0xf);
          CVar8 = CVar8 >> 4;
        }
        iVar4 = iVar4 + -7;
        lVar7 = lVar7 + 1;
      }
      pcVar6 = buffer + iVar4;
      for (uVar2 = this->bigits_buffer_[(long)this->used_bigits_ + -1]; uVar2 != 0;
          uVar2 = uVar2 >> 4) {
        cVar5 = '7';
        if ((uVar2 & 0xf) < 10) {
          cVar5 = '0';
        }
        *pcVar6 = cVar5 + (char)(uVar2 & 0xf);
        pcVar6 = pcVar6 + -1;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Bignum::ToHexString(char* buffer, const int buffer_size) const {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  // Each bigit must be printable as separate hex-character.
  DOUBLE_CONVERSION_ASSERT(kBigitSize % 4 == 0);
  static const int kHexCharsPerBigit = kBigitSize / 4;

  if (used_bigits_ == 0) {
    if (buffer_size < 2) {
      return false;
    }
    buffer[0] = '0';
    buffer[1] = '\0';
    return true;
  }
  // We add 1 for the terminating '\0' character.
  const int needed_chars = (BigitLength() - 1) * kHexCharsPerBigit +
    SizeInHexChars(RawBigit(used_bigits_ - 1)) + 1;
  if (needed_chars > buffer_size) {
    return false;
  }
  int string_index = needed_chars - 1;
  buffer[string_index--] = '\0';
  for (int i = 0; i < exponent_; ++i) {
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = '0';
    }
  }
  for (int i = 0; i < used_bigits_ - 1; ++i) {
    Chunk current_bigit = RawBigit(i);
    for (int j = 0; j < kHexCharsPerBigit; ++j) {
      buffer[string_index--] = HexCharOfValue(current_bigit & 0xF);
      current_bigit >>= 4;
    }
  }
  // And finally the last bigit.
  Chunk most_significant_bigit = RawBigit(used_bigits_ - 1);
  while (most_significant_bigit != 0) {
    buffer[string_index--] = HexCharOfValue(most_significant_bigit & 0xF);
    most_significant_bigit >>= 4;
  }
  return true;
}